

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O3

void __thiscall
google::
dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
::dense_hashtable(dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
                  *this,dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
                        *ht,size_type min_buckets_wanted)

{
  size_type sVar1;
  type_conflict1 tVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  undefined1 uVar6;
  uint uVar7;
  ulong uVar8;
  size_type sVar9;
  float fVar10;
  
  sVar9 = (ht->settings).
          super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
          enlarge_threshold_;
  sVar1 = (ht->settings).
          super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
          shrink_threshold_;
  fVar10 = (ht->settings).
           super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
           shrink_factor_;
  bVar3 = (ht->settings).
          super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
          consider_shrink_;
  bVar4 = (ht->settings).
          super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
          use_empty_;
  bVar5 = (ht->settings).
          super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
          use_deleted_;
  uVar6 = (ht->settings).
          super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
          field_0x1b;
  uVar7 = (ht->settings).
          super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
          num_ht_copies_;
  (this->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
  enlarge_factor_ =
       (ht->settings).
       super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
       enlarge_factor_;
  (this->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
  shrink_factor_ = fVar10;
  (this->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
  consider_shrink_ = bVar3;
  (this->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.use_empty_
       = bVar4;
  (this->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
  use_deleted_ = bVar5;
  (this->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.field_0x1b
       = uVar6;
  (this->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
  num_ht_copies_ = uVar7;
  (this->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
  enlarge_threshold_ = sVar9;
  (this->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
  shrink_threshold_ = sVar1;
  tVar2 = (ht->key_info).empty_key;
  (this->key_info).delkey = (ht->key_info).delkey;
  (this->key_info).empty_key = tVar2;
  this->table = (pointer)0x0;
  this->num_deleted = 0;
  this->num_elements = 0;
  this->num_buckets = 0;
  if ((ht->settings).
      super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
      use_empty_ != false) {
    fVar10 = (this->settings).
             super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
             enlarge_factor_ * 0.0;
    uVar8 = (ulong)fVar10;
    (this->settings).
    super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
    enlarge_threshold_ = (long)(fVar10 - 9.223372e+18) & (long)uVar8 >> 0x3f | uVar8;
    fVar10 = (this->settings).
             super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
             shrink_factor_ * 0.0;
    uVar8 = (ulong)fVar10;
    (this->settings).
    super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
    shrink_threshold_ = (long)(fVar10 - 9.223372e+18) & (long)uVar8 >> 0x3f | uVar8;
    (this->settings).
    super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
    consider_shrink_ = false;
    dense_hashtable<std::pair<unsigned_long_const,int>,unsigned_long,std::hash<unsigned_long>,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SelectKey,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SetKey,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>
    ::
    copy_or_move_from<google::dense_hashtable<std::pair<unsigned_long_const,int>,unsigned_long,std::hash<unsigned_long>,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SelectKey,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SetKey,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>>
              ((dense_hashtable<std::pair<unsigned_long_const,int>,unsigned_long,std::hash<unsigned_long>,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SelectKey,google::dense_hash_map<unsigned_long,int,std::hash<unsigned_long>,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>::SetKey,std::equal_to<unsigned_long>,google::libc_allocator_with_realloc<std::pair<unsigned_long_const,int>>>
                *)this,ht,min_buckets_wanted);
    return;
  }
  sVar9 = sparsehash_internal::
          sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>::
          min_buckets((sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>
                       *)this,ht->num_elements - ht->num_deleted,min_buckets_wanted);
  this->num_buckets = sVar9;
  fVar10 = (this->settings).
           super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
           enlarge_factor_ * (float)sVar9;
  uVar8 = (ulong)fVar10;
  (this->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
  enlarge_threshold_ = (long)(fVar10 - 9.223372e+18) & (long)uVar8 >> 0x3f | uVar8;
  fVar10 = (float)sVar9 *
           (this->settings).
           super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
           shrink_factor_;
  uVar8 = (ulong)fVar10;
  (this->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
  shrink_threshold_ = (long)(fVar10 - 9.223372e+18) & (long)uVar8 >> 0x3f | uVar8;
  (this->settings).
  super_sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>.
  consider_shrink_ = false;
  return;
}

Assistant:

dense_hashtable(dense_hashtable&& ht,
                  size_type min_buckets_wanted)
      : settings(ht.settings),
        key_info(ht.key_info),
        num_deleted(0),
        num_elements(0),
        num_buckets(0),
        val_info(std::move(ht.val_info)),
        table(NULL) {
    if (!ht.settings.use_empty()) {
      // If use_empty isn't set, copy_or_move_from will crash, so we do our own copying.
      assert(ht.empty());
      num_buckets = settings.min_buckets(ht.size(), min_buckets_wanted);
      settings.reset_thresholds(bucket_count());
      return;
    }
    settings.reset_thresholds(bucket_count());
    copy_or_move_from(std::move(ht), min_buckets_wanted);  // copy_or_move_from() ignores deleted entries
  }